

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

Gia_Man_t * Gia_ManPerformSopBalance(Gia_Man_t *p,int nCutNum,int nRelaxRatio,int fVerbose)

{
  char *pcVar1;
  If_Man_t *p_00;
  Gia_Man_t *p_01;
  size_t sVar2;
  char *pcVar3;
  If_Par_t *pPars;
  If_Par_t Pars;
  If_Par_t local_158;
  
  If_ManSetDefaultPars(&local_158);
  local_158.nLutSize = 6;
  local_158.fCutMin = 1;
  local_158.fDelayOpt = 1;
  local_158.fTruth = 1;
  local_158.fExpRed = 0;
  local_158.nCutsMax = nCutNum;
  local_158.nRelaxRatio = nRelaxRatio;
  local_158.fVerbose = fVerbose;
  p_00 = Gia_ManToIf(p,&local_158);
  If_ManPerformMapping(p_00);
  p_01 = Gia_ManFromIfAig(p_00);
  If_ManStop(p_00);
  Gia_ManTransferTiming(p_01,p);
  if (p_01->pName == (char *)0x0) {
    pcVar1 = p->pName;
    if (pcVar1 == (char *)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      sVar2 = strlen(pcVar1);
      pcVar3 = (char *)malloc(sVar2 + 1);
      strcpy(pcVar3,pcVar1);
    }
    p_01->pName = pcVar3;
    pcVar1 = p->pSpec;
    if (pcVar1 == (char *)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      sVar2 = strlen(pcVar1);
      pcVar3 = (char *)malloc(sVar2 + 1);
      strcpy(pcVar3,pcVar1);
    }
    p_01->pSpec = pcVar3;
    Gia_ManSetRegNum(p_01,p->nRegs);
    return p_01;
  }
  __assert_fail("pNew->pName == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                ,0x8bf,"Gia_Man_t *Gia_ManPerformSopBalance(Gia_Man_t *, int, int, int)");
}

Assistant:

Gia_Man_t * Gia_ManPerformSopBalance( Gia_Man_t * p, int nCutNum, int nRelaxRatio, int fVerbose )
{
    Gia_Man_t * pNew;
    If_Man_t * pIfMan;
    If_Par_t Pars, * pPars = &Pars;
    If_ManSetDefaultPars( pPars );
    pPars->nCutsMax    = nCutNum;
    pPars->nRelaxRatio = nRelaxRatio;
    pPars->fVerbose    = fVerbose;
    pPars->nLutSize    = 6;
    pPars->fDelayOpt   = 1;
    pPars->fCutMin     = 1;
    pPars->fTruth      = 1;
    pPars->fExpRed     = 0;
    // perform mapping
    pIfMan = Gia_ManToIf( p, pPars );
    If_ManPerformMapping( pIfMan );
    pNew = Gia_ManFromIfAig( pIfMan );
    If_ManStop( pIfMan );
    Gia_ManTransferTiming( pNew, p );
    // transfer name
    assert( pNew->pName == NULL );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}